

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O0

int Mtr_SwapGroups(MtrNode *first,MtrNode *second)

{
  MtrHalfWord MVar1;
  MtrHalfWord shift;
  MtrNode *pMVar2;
  int iVar3;
  int sizeSecond;
  int sizeFirst;
  MtrNode *parent;
  MtrNode *node;
  MtrNode *second_local;
  MtrNode *first_local;
  
  node = first;
  second_local = second;
  if ((second->younger == first) || (node = second, second_local = first, first->younger == second))
  {
    MVar1 = second_local->size;
    shift = node->size;
    pMVar2 = second_local->parent;
    if ((pMVar2 == (MtrNode *)0x0) || (node->parent != pMVar2)) {
      first_local._4_4_ = 0;
    }
    else {
      if (pMVar2->child == second_local) {
        pMVar2->child = node;
      }
      else {
        second_local->elder->younger = node;
      }
      if (node->younger != (MtrNode *)0x0) {
        node->younger->elder = second_local;
      }
      second_local->younger = node->younger;
      node->elder = second_local->elder;
      second_local->elder = node;
      node->younger = second_local;
      iVar3 = mtrShiftHL(second_local,shift);
      if (iVar3 == 0) {
        first_local._4_4_ = 0;
      }
      else {
        iVar3 = mtrShiftHL(node,-MVar1);
        if (iVar3 == 0) {
          first_local._4_4_ = 0;
        }
        else {
          first_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    first_local._4_4_ = 0;
  }
  return first_local._4_4_;
}

Assistant:

int
Mtr_SwapGroups(
  MtrNode * first /* first node to be swapped */,
  MtrNode * second /* second node to be swapped */)
{
    MtrNode *node;
    MtrNode *parent;
    int sizeFirst;
    int sizeSecond;

    if (second->younger == first) { /* make first first */
        node = first;
        first = second;
        second = node;
    } else if (first->younger != second) { /* non-adjacent */
        return(0);
    }

    sizeFirst = first->size;
    sizeSecond = second->size;

    /* Swap the two nodes. */
    parent = first->parent;
    if (parent == NULL || second->parent != parent) return(0);
    if (parent->child == first) {
        parent->child = second;
    } else { /* first->elder != NULL */
        first->elder->younger = second;
    }
    if (second->younger != NULL) {
        second->younger->elder = first;
    }
    first->younger = second->younger;
    second->elder = first->elder;
    first->elder = second;
    second->younger = first;

    /* Adjust the high and low fields. */
    if (!mtrShiftHL(first,sizeSecond)) return(0);
    if (!mtrShiftHL(second,-sizeFirst)) return(0);

    return(1);

}